

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this,Board *obj)

{
  bool bVar1;
  Trick *this_00;
  vector<Card,_std::allocator<Card>_> *this_01;
  pair<int,_std::vector<Card,_std::allocator<Card>_>_*> local_80;
  vector<Card,_std::allocator<Card>_> *local_70;
  Hand *newHandPointer;
  pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
  *__range1;
  Trick trick;
  Board *obj_local;
  Board *this_local;
  
  std::
  map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
  ::map(&this->m_player_hands);
  std::vector<Card,_std::allocator<Card>_>::vector(&this->m_discard_pile);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (&this->m_player_scores);
  std::
  map<int,_SuitPlayCapability,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
  ::map(&this->m_player_suited_capabilities);
  this->m_current_trump_suit = 3;
  this->m_player_to_move = obj->m_player_to_move;
  std::vector<Card,_std::allocator<Card>_>::operator=(&this->m_discard_pile,&obj->m_discard_pile);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
            (&this->m_player_scores,&obj->m_player_scores);
  std::
  map<int,_SuitPlayCapability,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
  ::operator=(&this->m_player_suited_capabilities,&obj->m_player_suited_capabilities);
  this->m_current_trump_suit = obj->m_current_trump_suit;
  if (obj->m_current_trick == (Trick *)0x0) {
    this->m_current_trick = (Trick *)0x0;
  }
  else {
    Trick::Trick((Trick *)&__range1,obj->m_current_trick);
    this_00 = (Trick *)operator_new(0x20);
    Trick::Trick(this_00);
    this->m_current_trick = this_00;
    Trick::operator=(this->m_current_trick,(Trick *)&__range1);
    Trick::~Trick((Trick *)&__range1);
  }
  __end1 = std::
           map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
           ::begin(&obj->m_player_hands);
  pair = (pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*> *)
         std::
         map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
         ::end(&obj->m_player_hands);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&pair);
    if (!bVar1) break;
    newHandPointer =
         (Hand *)std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>
                 ::operator*(&__end1);
    this_01 = (vector<Card,_std::allocator<Card>_> *)operator_new(0x18);
    (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Card,_std::allocator<Card>_>::vector(this_01);
    local_70 = this_01;
    std::vector<Card,_std::allocator<Card>_>::operator=
              (this_01,(vector<Card,_std::allocator<Card>_> *)
                       (newHandPointer->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    std::pair<int,_std::vector<Card,_std::allocator<Card>_>_*>::
    pair<std::vector<Card,_std::allocator<Card>_>_*&,_true>
              (&local_80,(int *)newHandPointer,&local_70);
    std::
    map<int,std::vector<Card,std::allocator<Card>>*,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
    ::insert<std::pair<int,std::vector<Card,std::allocator<Card>>*>>
              ((map<int,std::vector<Card,std::allocator<Card>>*,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
                *)this,&local_80);
    std::_Rb_tree_const_iterator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Board::Board(const Board &obj)
{
    m_player_to_move = obj.m_player_to_move;
    m_discard_pile = obj.m_discard_pile;
    m_player_scores = obj.m_player_scores;
    m_player_suited_capabilities = obj.m_player_suited_capabilities;
    m_current_trump_suit = obj.m_current_trump_suit;
    if(obj.m_current_trick == NULL) {
        m_current_trick = NULL;
    }
    else{
        Trick trick = *obj.m_current_trick;
        m_current_trick = new Trick();
        *m_current_trick = trick;
    }
    for(auto const &pair : obj.m_player_hands) {
        Hand* newHandPointer = new Hand();
        *newHandPointer = *pair.second;
        m_player_hands.insert(std::pair<int, Hand*>(pair.first, newHandPointer));
    }
}